

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInteger64StateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Integer64StateQueryTests::init
          (Integer64StateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetFloatVerifier *this_02;
  undefined4 extraout_var_01;
  ConstantMinimumValue64TestCase *this_03;
  char *pcVar6;
  long lVar7;
  StateVerifier *pSVar8;
  MaxCombinedStageUniformComponentsCase *pMVar9;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  StateVerifier *local_158;
  StateVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  StateVerifier *local_108;
  StateVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  StateVerifier *local_b8;
  StateVerifier *verifier;
  int _verifierNdx;
  int testNdx;
  StateVerifier *verifiers [3];
  undefined8 local_88;
  LimitedStateInteger64 implementationLimits [3];
  Integer64StateQueryTests *this_local;
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  Integer64StateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  Integer64StateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar2),pTVar5);
  this->m_verifierInteger = this_01;
  this_02 = (GetFloatVerifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  Integer64StateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar2),pTVar5);
  this->m_verifierFloat = this_02;
  memcpy(&local_88,&PTR_anon_var_dwarf_149b06e_032ab6b0,0x60);
  __verifierNdx = this->m_verifierBoolean;
  verifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  pSVar8 = &this->m_verifierFloat->super_StateVerifier;
  verifiers[1] = pSVar8;
  verifier._4_4_ = 0;
  while ((int)verifier._4_4_ < 3) {
    for (verifier._0_4_ = 0; (int)verifier < 3; verifier._0_4_ = (int)verifier + 1) {
      local_b8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier * 2);
      this_03 = (ConstantMinimumValue64TestCase *)operator_new(0xb0);
      pSVar8 = local_b8;
      verifier_1._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar6 = (char *)implementationLimits[(long)(int)verifier._4_4_ + -1].minValue;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_1,pcVar6,(allocator<char> *)((long)&verifier_1 + 7));
      pcVar6 = Integer64StateQueryVerifiers::StateVerifier::getTestNamePostfix(local_b8);
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_1,pcVar6);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      lVar7 = (long)(int)verifier._4_4_;
      anon_unknown_2::ConstantMinimumValue64TestCase::ConstantMinimumValue64TestCase
                (this_03,pCVar1,pSVar8,pcVar6,implementationLimits[lVar7].name,
                 *(GLenum *)&implementationLimits[lVar7].description,
                 *(GLuint64 *)&implementationLimits[lVar7].targetName);
      verifier_1._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&_verifierNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    }
    verifier._4_4_ = verifier._4_4_ + 1;
    pSVar8 = (StateVerifier *)(ulong)verifier._4_4_;
  }
  verifier_1._0_4_ = 0;
  while ((int)(uint)verifier_1 < 3) {
    local_108 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_1 * 2);
    pMVar9 = (MaxCombinedStageUniformComponentsCase *)operator_new(0xb0);
    pSVar8 = local_108;
    verifier_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_2,"max_combined_vertex_uniform_components",
               (allocator<char> *)((long)&verifier_2 + 7));
    pcVar6 = Integer64StateQueryVerifiers::StateVerifier::getTestNamePostfix(local_108);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_2,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::MaxCombinedStageUniformComponentsCase::MaxCombinedStageUniformComponentsCase
              (pMVar9,pCVar1,pSVar8,pcVar6,"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",0x8a31,0x8a2b,
               0x8b4a);
    verifier_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar9);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&_verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
    verifier_1._0_4_ = (uint)verifier_1 + 1;
    pSVar8 = (StateVerifier *)(ulong)(uint)verifier_1;
  }
  verifier_2._0_4_ = 0;
  while ((int)(uint)verifier_2 < 3) {
    local_158 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_2 * 2);
    pMVar9 = (MaxCombinedStageUniformComponentsCase *)operator_new(0xb0);
    pSVar8 = local_158;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"max_combined_fragment_uniform_components",&local_199);
    pcVar6 = Integer64StateQueryVerifiers::StateVerifier::getTestNamePostfix(local_158);
    std::operator+(&local_178,&local_198,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::MaxCombinedStageUniformComponentsCase::MaxCombinedStageUniformComponentsCase
              (pMVar9,pCVar1,pSVar8,pcVar6,"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",0x8a33,0x8a2d,
               0x8b49);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar9);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    verifier_2._0_4_ = (uint)verifier_2 + 1;
    pSVar8 = (StateVerifier *)(ulong)(uint)verifier_2;
  }
  return (int)pSVar8;
}

Assistant:

void Integer64StateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier			(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger64
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLuint64		minValue;
	} implementationLimits[] =
	{
		{ "max_element_index",			"MAX_ELEMENT_INDEX",		GL_MAX_ELEMENT_INDEX,			0x00FFFFFF /*2^24-1*/	},
		{ "max_server_wait_timeout",	"MAX_SERVER_WAIT_TIMEOUT",	GL_MAX_SERVER_WAIT_TIMEOUT,		0						},
		{ "max_uniform_block_size",		"MAX_UNIFORM_BLOCK_SIZE",	GL_MAX_UNIFORM_BLOCK_SIZE,		16384					}
	};

	// \note do not check the values with integer64 verifier as that has already been checked in implementation_limits
	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationLimits); testNdx++)
		FOR_EACH_VERIFIER(verifiers, addChild(new ConstantMinimumValue64TestCase(m_context, verifier, (std::string(implementationLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationLimits[testNdx].description, implementationLimits[testNdx].targetName, implementationLimits[testNdx].minValue)));

	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_vertex_uniform_components")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS,		GL_MAX_VERTEX_UNIFORM_BLOCKS,		GL_MAX_VERTEX_UNIFORM_COMPONENTS)));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_fragment_uniform_components")	+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS,	GL_MAX_FRAGMENT_UNIFORM_BLOCKS,		GL_MAX_FRAGMENT_UNIFORM_COMPONENTS)));
}